

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O2

void __thiscall QWidgetResizeHandler::mouseMoveEvent(QWidgetResizeHandler *this,QMouseEvent *e)

{
  QRect *pQVar1;
  uint uVar2;
  QWidgetData *pQVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  char cVar8;
  Representation RVar9;
  QPoint QVar10;
  QSize QVar11;
  QSize QVar12;
  Representation RVar13;
  Representation RVar14;
  MousePosition m;
  Representation RVar15;
  Representation RVar16;
  QWidget *pQVar17;
  Representation RVar18;
  int iVar19;
  Representation RVar20;
  int iVar21;
  Representation RVar22;
  Representation RVar23;
  Representation RVar24;
  Representation RVar25;
  Representation RVar26;
  ulong uVar27;
  long in_FS_OFFSET;
  QRect QVar28;
  QSize local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  undefined8 uStack_60;
  QPoint local_48;
  QPoint local_40;
  long local_38;
  
  local_78._8_8_ = local_78._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar17 = *(QWidget **)(this + 0x10);
  _local_68 = (QRect)QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
  QVar10 = QPointF::toPoint((QPointF *)local_68);
  local_78._0_4_ = QVar10.xp.m_i;
  local_78._4_4_ = QVar10.yp.m_i;
  local_40 = QWidget::mapFromGlobal(pQVar17,(QPoint *)local_78);
  if (((byte)this[0x40] & 3) == 0) {
    iVar19 = *(int *)(this + 0x3c);
    RVar18 = local_40.yp.m_i;
    RVar16 = local_40.xp.m_i;
    if (iVar19 < RVar16.m_i || iVar19 < RVar18.m_i) {
      pQVar3 = (*(QWidget **)(this + 0x10))->data;
      if (RVar18.m_i < ((pQVar3->crect).y2.m_i - ((pQVar3->crect).y1.m_i + iVar19)) + 1) {
        if (iVar19 < RVar18.m_i) {
          if (iVar19 < RVar16.m_i) {
            if (RVar16.m_i < ((pQVar3->crect).x2.m_i - ((pQVar3->crect).x1.m_i + iVar19)) + 1) {
              _local_68 = QWidget::rect(*(QWidget **)(this + 0x10));
              cVar8 = QRect::contains((QPoint *)local_68,SUB81(&local_40,0));
              if (cVar8 == '\0') {
                *(undefined4 *)(this + 0x30) = 0;
              }
              else {
                *(undefined4 *)(this + 0x30) = 9;
              }
            }
            else {
              *(undefined4 *)(this + 0x30) = 8;
            }
          }
          else {
            *(undefined4 *)(this + 0x30) = 7;
          }
        }
        else {
          iVar21 = ((pQVar3->crect).x2.m_i - ((pQVar3->crect).x1.m_i + iVar19)) + 1;
LAB_0043386c:
          if (RVar16.m_i < iVar21) {
            *(undefined4 *)(this + 0x30) = 5;
          }
          else {
            *(undefined4 *)(this + 0x30) = 4;
          }
        }
      }
      else {
        iVar21 = ((pQVar3->crect).x2.m_i - ((pQVar3->crect).x1.m_i + iVar19)) + 1;
        if (RVar16.m_i < iVar21) {
          if (iVar19 < RVar16.m_i) {
            if (RVar18.m_i <= iVar19) goto LAB_0043386c;
            *(undefined4 *)(this + 0x30) = 6;
          }
          else {
            *(undefined4 *)(this + 0x30) = 3;
          }
        }
        else {
          *(undefined4 *)(this + 0x30) = 2;
        }
      }
    }
    else {
      *(undefined4 *)(this + 0x30) = 1;
    }
    bVar7 = QWidget::isMinimized(*(QWidget **)(this + 0x10));
    if ((bVar7) || (((byte)this[0x40] & 4) == 0)) {
      *(undefined4 *)(this + 0x30) = 9;
      m = Center;
    }
    else {
      m = *(MousePosition *)(this + 0x30);
    }
    setMouseCursor(this,m);
    goto LAB_00433676;
  }
  if ((*(int *)(this + 0x30) == 9) ||
     (bVar7 = QWidget::testAttribute_helper(*(QWidget **)(this + 0x10),WA_WState_ConfigPending),
     bVar7)) goto LAB_00433676;
  local_48 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  if (((*(byte *)(*(long *)(*(long *)(this + 0x10) + 0x20) + 0xc) & 1) == 0) &&
     (pQVar17 = *(QWidget **)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10),
     pQVar17 != (QWidget *)0x0)) {
    _local_68 = (QRect)QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
    QVar10 = QPointF::toPoint((QPointF *)local_68);
    local_78._0_4_ = QVar10.xp.m_i;
    local_78._4_4_ = QVar10.yp.m_i;
    QVar10 = QWidget::mapFromGlobal(pQVar17,(QPoint *)local_78);
  }
  else {
    _local_68 = (QRect)QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
    QVar10 = QPointF::toPoint((QPointF *)local_68);
  }
  local_48 = QVar10;
  if ((*(byte *)(*(long *)(*(long *)(this + 0x10) + 0x20) + 0xc) & 1) == 0) {
    _local_68 = QWidget::rect(*(QWidget **)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10));
    cVar8 = QRect::contains((QPoint *)local_68,SUB81(&local_48,0));
    QVar10 = (QPoint)((ulong)local_48 & 0xffffffff);
    RVar16.m_i = local_48.yp.m_i;
    if (cVar8 == '\0') {
      if (local_48.xp.m_i < 0) {
        local_48 = (QPoint)((ulong)(uint)local_48.yp.m_i << 0x20);
        QVar10.xp.m_i = 0;
        QVar10.yp.m_i = 0;
      }
      RVar16.m_i = local_48.yp.m_i;
      if ((long)local_48 < 0) {
        local_48 = (QPoint)((ulong)local_48 & 0xffffffff);
        RVar16.m_i = 0;
      }
      lVar4 = *(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + 8) + 0x10) + 0x20);
      RVar18.m_i = (*(int *)(lVar4 + 0x1c) - *(int *)(lVar4 + 0x14)) + 1;
      if (RVar18.m_i < QVar10.xp.m_i.m_i) {
        local_48.xp.m_i = RVar18.m_i;
        QVar10.yp.m_i = 0;
        QVar10.xp.m_i = RVar18.m_i;
      }
      RVar18.m_i = (*(int *)(lVar4 + 0x20) - *(int *)(lVar4 + 0x18)) + 1;
      if (RVar18.m_i < RVar16.m_i) {
        local_48.yp.m_i = RVar18.m_i;
        RVar16.m_i = RVar18.m_i;
      }
    }
  }
  else {
    RVar16.m_i = QVar10.yp.m_i.m_i;
  }
  RVar25.m_i = *(int *)(this + 0x28) + QVar10.xp.m_i.m_i;
  iVar21 = *(int *)(this + 0x2c) + RVar16.m_i;
  RVar15.m_i = QVar10.xp.m_i.m_i - *(int *)(this + 0x20);
  iVar19 = RVar16.m_i - *(int *)(this + 0x24);
  QGuiApplication::platformName();
  local_78._8_8_ = "xcb";
  local_78._0_8_ = 3;
  bVar7 = ::operator==((QString *)local_68,(QLatin1StringView *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  RVar24.m_i = iVar19;
  RVar22.m_i = iVar21;
  if (bVar7) {
    QVar28 = QWidgetPrivate::availableScreenGeometry(*(QWidget **)(this + 0x10));
    if (RVar15.m_i <= QVar28.x1.m_i.m_i) {
      RVar15.m_i = QVar28.x1.m_i.m_i;
    }
    RVar24.m_i = QVar28.y1.m_i.m_i;
    if (QVar28.y1.m_i.m_i < iVar19) {
      RVar24.m_i = iVar19;
    }
    if (QVar28.x2.m_i.m_i <= RVar25.m_i) {
      RVar25.m_i = QVar28.x2.m_i.m_i;
    }
    RVar22.m_i = QVar28.y2.m_i.m_i;
    if (iVar21 < QVar28.y2.m_i.m_i) {
      RVar22.m_i = iVar21;
    }
  }
  uVar27 = (ulong)(uint)RVar25.m_i;
  local_88 = qSmartMinSize(*(QWidget **)(this + 0x18));
  RVar13 = local_88.ht.m_i;
  if (*(QWidget **)(this + 0x18) != *(QWidget **)(this + 0x10)) {
    local_88.wd.m_i = local_88.wd.m_i.m_i + *(int *)(this + 0x34) * 2;
    local_88.ht.m_i = 0;
    RVar13.m_i = RVar13.m_i + *(int *)(this + 0x38) + *(int *)(this + 0x34) * 2;
  }
  QVar11 = QWidget::maximumSize(*(QWidget **)(this + 0x18));
  RVar26 = QVar11.ht.m_i;
  pQVar17 = *(QWidget **)(this + 0x10);
  if (*(QWidget **)(this + 0x18) != pQVar17) {
    QVar11.wd.m_i = QVar11.wd.m_i.m_i + *(int *)(this + 0x34) * 2;
    QVar11.ht.m_i = 0;
    RVar26.m_i = RVar26.m_i + *(int *)(this + 0x38) + *(int *)(this + 0x34) * 2;
  }
  RVar14.m_i = ((pQVar17->data->crect).x2.m_i - RVar15.m_i) + 1;
  RVar23.m_i = ((pQVar17->data->crect).y2.m_i - RVar24.m_i) + 1;
  QVar12 = QWidget::minimumSize(pQVar17);
  if (RVar14.m_i <= QVar12.wd.m_i.m_i) {
    RVar14.m_i = QVar12.wd.m_i.m_i;
  }
  if (RVar23.m_i <= QVar12.ht.m_i.m_i) {
    RVar23.m_i = QVar12.ht.m_i.m_i;
  }
  RVar9 = local_88.wd.m_i;
  if (RVar14.m_i <= RVar9.m_i) {
    RVar14.m_i = RVar9.m_i;
  }
  if (RVar23.m_i <= RVar13.m_i) {
    RVar23.m_i = RVar13.m_i;
  }
  RVar20 = QVar11.wd.m_i;
  if (RVar20.m_i <= RVar14.m_i) {
    RVar14.m_i = RVar20.m_i;
  }
  if (RVar26.m_i <= RVar23.m_i) {
    RVar23.m_i = RVar26.m_i;
  }
  pQVar3 = (*(QWidget **)(this + 0x10))->data;
  uVar2 = (pQVar3->crect).x2.m_i;
  iVar19 = (pQVar3->crect).y2.m_i;
  uVar5._0_4_ = (pQVar3->crect).x2;
  uVar5._4_4_ = (pQVar3->crect).y2;
  _local_68 = pQVar3->crect;
  if (7 < *(int *)(this + 0x30) - 1U) {
    uVar27 = uVar5 & 0xffffffff;
    RVar22.m_i = uVar5._4_4_;
    goto LAB_00433989;
  }
  pQVar1 = &pQVar3->crect;
  RVar16.m_i = (uVar2 - RVar14.m_i) + 1;
  RVar18.m_i = (iVar19 - RVar23.m_i) + 1;
  switch(*(int *)(this + 0x30)) {
  case 1:
    uVar27._0_4_ = (pQVar3->crect).x2;
    uVar27._4_4_ = (pQVar3->crect).y2;
    goto LAB_0043391c;
  case 2:
    local_68._0_4_ = pQVar1->x1;
    local_68._4_4_ = pQVar1->y1;
    break;
  case 3:
    local_68._4_4_ = (pQVar3->crect).y1.m_i;
    local_68._0_4_ = RVar16.m_i;
    goto LAB_00433962;
  case 4:
    local_68._4_4_ = RVar18.m_i;
    local_68._0_4_ = (pQVar1->x1).m_i;
    RVar22.m_i = iVar19;
    break;
  case 5:
    RVar16.m_i = (pQVar3->crect).x1.m_i;
    uVar27._0_4_ = (pQVar3->crect).x2;
    uVar27._4_4_ = (pQVar3->crect).y2;
LAB_0043391c:
    RVar22.m_i = (int)(uVar27 >> 0x20);
    local_68._4_4_ = RVar18.m_i;
    local_68._0_4_ = RVar16.m_i;
    goto LAB_00433989;
  case 6:
    local_68._0_4_ = pQVar1->x1;
    local_68._4_4_ = pQVar1->y1;
LAB_00433962:
    local_68._0_4_ = local_68._0_4_;
    local_68._4_4_ = local_68._4_4_;
    uVar27 = (ulong)uVar2;
    goto LAB_00433989;
  case 7:
    uVar27._0_4_ = (pQVar3->crect).x2;
    uVar27._4_4_ = (pQVar3->crect).y2;
    local_68._4_4_ = (pQVar3->crect).y1.m_i;
    local_68._0_4_ = RVar16.m_i;
    RVar22.m_i = uVar27._4_4_;
    goto LAB_00433989;
  case 8:
    local_68._0_4_ = pQVar1->x1;
    local_68._4_4_ = pQVar1->y1;
    RVar22.m_i = iVar19;
  }
  local_68._0_4_ = local_68._0_4_;
  local_68._4_4_ = local_68._4_4_;
LAB_00433989:
  auVar6 = local_68;
  RVar24 = local_68._0_4_;
  RVar14.m_i = ((int)uVar27 - RVar24.m_i) + 1;
  RVar25 = local_68._4_4_;
  RVar23.m_i = (RVar22.m_i - RVar25.m_i) + 1;
  QVar11 = QWidget::minimumSize(*(QWidget **)(this + 0x10));
  if (RVar14.m_i <= QVar11.wd.m_i.m_i) {
    RVar14.m_i = QVar11.wd.m_i.m_i;
  }
  if (RVar23.m_i <= QVar11.ht.m_i.m_i) {
    RVar23.m_i = QVar11.ht.m_i.m_i;
  }
  if (RVar14.m_i <= RVar9.m_i) {
    RVar14.m_i = RVar9.m_i;
  }
  if (RVar23.m_i <= RVar13.m_i) {
    RVar23.m_i = RVar13.m_i;
  }
  if (RVar20.m_i <= RVar14.m_i) {
    RVar14.m_i = RVar20.m_i;
  }
  if (RVar26.m_i <= RVar23.m_i) {
    RVar23.m_i = RVar26.m_i;
  }
  uStack_60._0_4_ = RVar24.m_i + RVar14.m_i + -1;
  _local_68 = CONCAT48(uStack_60._0_4_,auVar6);
  uStack_60._4_4_ = RVar25.m_i + -1 + RVar23.m_i;
  bVar7 = ::operator!=((QRect *)local_68,(QRect *)(*(long *)(*(long *)(this + 0x10) + 0x20) + 0x14))
  ;
  if (bVar7) {
    pQVar17 = *(QWidget **)(this + 0x10);
    if (((pQVar17->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      local_78 = (undefined1  [16])QWidget::rect(*(QWidget **)(*(long *)&pQVar17->field_0x8 + 0x10))
      ;
      cVar8 = QRect::intersects((QRect *)local_78);
      if (cVar8 == '\0') goto LAB_00433676;
      pQVar17 = *(QWidget **)(this + 0x10);
    }
    QWidget::setGeometry(pQVar17,(QRect *)local_68);
  }
LAB_00433676:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::mouseMoveEvent(QMouseEvent *e)
{
    QPoint pos = widget->mapFromGlobal(e->globalPosition().toPoint());
    if (!active && !buttonDown) {
        if (pos.y() <= range && pos.x() <= range)
            mode = TopLeft;
        else if (pos.y() >= widget->height()-range && pos.x() >= widget->width()-range)
            mode = BottomRight;
        else if (pos.y() >= widget->height()-range && pos.x() <= range)
            mode = BottomLeft;
        else if (pos.y() <= range && pos.x() >= widget->width()-range)
            mode = TopRight;
        else if (pos.y() <= range)
            mode = Top;
        else if (pos.y() >= widget->height()-range)
            mode = Bottom;
        else if (pos.x() <= range)
            mode = Left;
        else if ( pos.x() >= widget->width()-range)
            mode = Right;
        else if (widget->rect().contains(pos))
            mode = Center;
        else
            mode = Nowhere;

        if (widget->isMinimized() || !isEnabled())
            mode = Center;
#ifndef QT_NO_CURSOR
        setMouseCursor(mode);
#endif
        return;
    }

    if (mode == Center)
        return;

    if (widget->testAttribute(Qt::WA_WState_ConfigPending))
        return;


    QPoint globalPos = (!widget->isWindow() && widget->parentWidget()) ?
                       widget->parentWidget()->mapFromGlobal(e->globalPosition().toPoint()) : e->globalPosition().toPoint();
    if (!widget->isWindow() && !widget->parentWidget()->rect().contains(globalPos)) {
        if (globalPos.x() < 0)
            globalPos.rx() = 0;
        if (globalPos.y() < 0)
            globalPos.ry() = 0;
        if (globalPos.x() > widget->parentWidget()->width())
            globalPos.rx() = widget->parentWidget()->width();
        if (globalPos.y() > widget->parentWidget()->height())
            globalPos.ry() = widget->parentWidget()->height();
    }

    QPoint p = globalPos + invertedMoveOffset;
    QPoint pp = globalPos - moveOffset;

    // Workaround for window managers which refuse to move a tool window partially offscreen.
    if (QGuiApplication::platformName() == "xcb"_L1) {
        const QRect desktop = QWidgetPrivate::availableScreenGeometry(widget);
        pp.rx() = qMax(pp.x(), desktop.left());
        pp.ry() = qMax(pp.y(), desktop.top());
        p.rx() = qMin(p.x(), desktop.right());
        p.ry() = qMin(p.y(), desktop.bottom());
    }

    QSize ms = qSmartMinSize(childWidget);
    int mw = ms.width();
    int mh = ms.height();
    if (childWidget != widget) {
        mw += 2 * fw;
        mh += 2 * fw + extrahei;
    }

    QSize maxsize(childWidget->maximumSize());
    if (childWidget != widget)
        maxsize += QSize(2 * fw, 2 * fw + extrahei);
    QSize mpsize(widget->geometry().right() - pp.x() + 1,
                  widget->geometry().bottom() - pp.y() + 1);
    mpsize = mpsize.expandedTo(widget->minimumSize()).expandedTo(QSize(mw, mh))
                    .boundedTo(maxsize);
    QPoint mp(widget->geometry().right() - mpsize.width() + 1,
               widget->geometry().bottom() - mpsize.height() + 1);

    QRect geom = widget->geometry();

    switch (mode) {
    case TopLeft:
        geom = QRect(mp, widget->geometry().bottomRight()) ;
        break;
    case BottomRight:
        geom = QRect(widget->geometry().topLeft(), p) ;
        break;
    case BottomLeft:
        geom = QRect(QPoint(mp.x(), widget->geometry().y()), QPoint(widget->geometry().right(), p.y())) ;
        break;
    case TopRight:
        geom = QRect(QPoint(widget->geometry().x(), mp.y()), QPoint(p.x(), widget->geometry().bottom())) ;
        break;
    case Top:
        geom = QRect(QPoint(widget->geometry().left(), mp.y()), widget->geometry().bottomRight()) ;
        break;
    case Bottom:
        geom = QRect(widget->geometry().topLeft(), QPoint(widget->geometry().right(), p.y())) ;
        break;
    case Left:
        geom = QRect(QPoint(mp.x(), widget->geometry().top()), widget->geometry().bottomRight()) ;
        break;
    case Right:
        geom = QRect(widget->geometry().topLeft(), QPoint(p.x(), widget->geometry().bottom())) ;
        break;
    default:
        break;
    }

    geom = QRect(geom.topLeft(),
                  geom.size().expandedTo(widget->minimumSize())
                             .expandedTo(QSize(mw, mh))
                             .boundedTo(maxsize));

    if (geom != widget->geometry() &&
        (widget->isWindow() || widget->parentWidget()->rect().intersects(geom))) {
        widget->setGeometry(geom);
    }
}